

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.c
# Opt level: O1

CBS_HANDLE cbs_create(SESSION_HANDLE session)

{
  int iVar1;
  CBS_HANDLE __ptr;
  SINGLYLINKEDLIST_HANDLE list;
  AMQP_MANAGEMENT_HANDLE amqp_management;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  
  if (session == (SESSION_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (CBS_HANDLE)0x0;
    }
    pcVar3 = "NULL session handle";
    iVar1 = 0x10d;
LAB_0010d0c8:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c",
              "cbs_create",iVar1,1,pcVar3);
    return (CBS_HANDLE)0x0;
  }
  __ptr = (CBS_HANDLE)calloc(1,0x38);
  if (__ptr == (CBS_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (CBS_HANDLE)0x0;
    }
    pcVar3 = "Cannot allocate memory for cbs instance.";
    iVar1 = 0x116;
    goto LAB_0010d0c8;
  }
  list = singlylinkedlist_create();
  __ptr->pending_operations = list;
  if (list == (SINGLYLINKEDLIST_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c",
                "cbs_create",0x11f,1,"Cannot allocate pending operations list.");
    }
    goto LAB_0010d1a2;
  }
  amqp_management = amqp_management_create(session,"$cbs");
  __ptr->amqp_management = amqp_management;
  if (amqp_management == (AMQP_MANAGEMENT_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c",
                "cbs_create",0x129,1,"Cannot create AMQP management instance for the $cbs node.");
    }
  }
  else {
    iVar1 = amqp_management_set_override_status_code_key_name(amqp_management,"status-code");
    if (iVar1 == 0) {
      iVar1 = amqp_management_set_override_status_description_key_name
                        (amqp_management,"status-description");
      if (iVar1 == 0) {
        __ptr->cbs_state = CBS_STATE_CLOSED;
        return __ptr;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar3 = "Cannot set the override status description key name";
        iVar1 = 0x139;
        goto LAB_0010d187;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar3 = "Cannot set the override status code key name";
        iVar1 = 0x131;
LAB_0010d187:
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c"
                  ,"cbs_create",iVar1,1,pcVar3);
      }
    }
    amqp_management_destroy(amqp_management);
  }
  singlylinkedlist_destroy(list);
LAB_0010d1a2:
  free(__ptr);
  return (CBS_HANDLE)0x0;
}

Assistant:

CBS_HANDLE cbs_create(SESSION_HANDLE session)
{
    CBS_INSTANCE* cbs;

    if (session == NULL)
    {
        /* Codes_SRS_CBS_01_033: [** If `session` is NULL then `cbs_create` shall fail and return NULL. ]*/
        LogError("NULL session handle");
        cbs = NULL;
    }
    else
    {
        cbs = (CBS_INSTANCE*)calloc(1, sizeof(CBS_INSTANCE));
        if (cbs == NULL)
        {
            /* Codes_SRS_CBS_01_076: [ If allocating memory for the new handle fails, `cbs_create` shall fail and return NULL. ]*/
            LogError("Cannot allocate memory for cbs instance.");
        }
        else
        {
            /* Codes_SRS_CBS_01_097: [ `cbs_create` shall create a singly linked list for pending operations by calling `singlylinkedlist_create`. ]*/
            cbs->pending_operations = singlylinkedlist_create();
            if (cbs->pending_operations == NULL)
            {
                /* Codes_SRS_CBS_01_101: [ If `singlylinkedlist_create` fails, `cbs_create` shall fail and return NULL. ]*/
                LogError("Cannot allocate pending operations list.");
            }
            else
            {
                /* Codes_SRS_CBS_01_034: [ `cbs_create` shall create an AMQP management handle by calling `amqp_management_create`. ]*/
                /* Codes_SRS_CBS_01_002: [ Tokens are communicated between AMQP peers by sending specially-formatted AMQP messages to the Claims-based Security Node. ]*/
                /* Codes_SRS_CBS_01_003: [ The mechanism follows the scheme defined in the AMQP Management specification [AMQPMAN]. ]*/
                cbs->amqp_management = amqp_management_create(session, "$cbs");
                if (cbs->amqp_management == NULL)
                {
                    LogError("Cannot create AMQP management instance for the $cbs node.");
                }
                else
                {
                    /* Codes_SRS_CBS_01_116: [ If setting the override key names fails, then `cbs_create` shall fail and return NULL. ]*/
                    if (amqp_management_set_override_status_code_key_name(cbs->amqp_management, "status-code") != 0)
                    {
                        /* Codes_SRS_CBS_01_116: [ If setting the override key names fails, then `cbs_create` shall fail and return NULL. ]*/
                        LogError("Cannot set the override status code key name");
                    }
                    else
                    {
                        /* Codes_SRS_CBS_01_118: [ `cbs_create` shall set the override status description key name on the AMQP management handle to `status-description` by calling `amqp_management_set_override_status_description_key_name`. ]*/
                        if (amqp_management_set_override_status_description_key_name(cbs->amqp_management, "status-description") != 0)
                        {
                            /* Codes_SRS_CBS_01_116: [ If setting the override key names fails, then `cbs_create` shall fail and return NULL. ]*/
                            LogError("Cannot set the override status description key name");
                        }
                        else
                        {
                            /* Codes_SRS_CBS_01_001: [ `cbs_create` shall create a new CBS instance and on success return a non-NULL handle to it. ]*/
                            cbs->cbs_state = CBS_STATE_CLOSED;

                            goto all_ok;
                        }
                    }

                    amqp_management_destroy(cbs->amqp_management);
                }

                singlylinkedlist_destroy(cbs->pending_operations);
            }

            free(cbs);
            cbs = NULL;
        }
    }

all_ok:
    return cbs;
}